

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScene::mousePressEvent(QGraphicsScene *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QGraphicsScenePrivate *this_00;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  if ((this_00->mouseGrabberItems).d.size == 0) {
    local_28.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)&local_38,None);
    _q_hoverFromMouseEvent((QGraphicsSceneHoverEvent *)&local_38,mouseEvent);
    QGraphicsScenePrivate::dispatchHoverEvent(this_00,(QGraphicsSceneHoverEvent *)&local_38);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_38);
  }
  QGraphicsScenePrivate::mousePressEventHandler(this_00,mouseEvent);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::mousePressEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_D(QGraphicsScene);
    if (d->mouseGrabberItems.isEmpty()) {
        // Dispatch hover events
        QGraphicsSceneHoverEvent hover;
        _q_hoverFromMouseEvent(&hover, mouseEvent);
        d->dispatchHoverEvent(&hover);
    }

    d->mousePressEventHandler(mouseEvent);
}